

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es3fBufferObjectQueryTests.cpp
# Opt level: O2

void __thiscall deqp::gles3::Functional::anon_unknown_2::BufferCase::test(BufferCase *this)

{
  CallLogWrapper *this_00;
  bool bVar1;
  ulong in_RAX;
  long lVar2;
  ulong uStack_38;
  GLuint bufferId;
  
  bVar1 = this->m_testAllTargets;
  this_00 = &(this->super_ApiCase).super_CallLogWrapper;
  uStack_38 = in_RAX;
  for (lVar2 = 0; (ulong)bVar1 * 0x10 + 0x10 != lVar2; lVar2 = lVar2 + 4) {
    this->m_bufferTarget = *(GLenum *)((long)&DAT_0185e7b0 + lVar2);
    uStack_38 = uStack_38 & 0xffffffff;
    glu::CallLogWrapper::glGenBuffers(this_00,1,&bufferId);
    glu::CallLogWrapper::glBindBuffer(this_00,this->m_bufferTarget,bufferId);
    ApiCase::expectError(&this->super_ApiCase,0);
    (*(this->super_ApiCase).super_TestCase.super_TestCase.super_TestNode._vptr_TestNode[6])(this);
    glu::CallLogWrapper::glDeleteBuffers(this_00,1,&bufferId);
    ApiCase::expectError(&this->super_ApiCase,0);
  }
  return;
}

Assistant:

void test (void)
	{
		const GLenum bufferTargets[] =
		{
			GL_ARRAY_BUFFER, GL_COPY_READ_BUFFER,
			GL_TRANSFORM_FEEDBACK_BUFFER, GL_UNIFORM_BUFFER,

			GL_COPY_WRITE_BUFFER, GL_ELEMENT_ARRAY_BUFFER,
			GL_PIXEL_PACK_BUFFER, GL_PIXEL_UNPACK_BUFFER
		};

		// most test need only to be run with a subset of targets
		const int targets = m_testAllTargets ? DE_LENGTH_OF_ARRAY(bufferTargets) : 4;

		for (int ndx = 0; ndx < targets; ++ndx)
		{
			m_bufferTarget = bufferTargets[ndx];

			GLuint bufferId = 0;
			glGenBuffers(1, &bufferId);
			glBindBuffer(m_bufferTarget, bufferId);
			expectError(GL_NO_ERROR);

			testBuffer();

			glDeleteBuffers(1, &bufferId);
			expectError(GL_NO_ERROR);
		}
	}